

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O0

void usrc_writeArrayOfMostlyInvChars(FILE *f,char *prefix,char *p,int32_t length,char *postfix)

{
  uint uVar1;
  char *__format;
  uint local_40;
  int c;
  int prev;
  int prev2;
  int32_t col;
  int32_t i;
  char *postfix_local;
  int32_t length_local;
  char *p_local;
  char *prefix_local;
  FILE *f_local;
  
  if (prefix != (char *)0x0) {
    fprintf((FILE *)f,prefix,(long)length);
  }
  local_40 = 0xffffffff;
  c = -1;
  prev = 0;
  for (prev2 = 0; prev2 < length; prev2 = prev2 + 1) {
    uVar1 = (uint)(byte)p[prev2];
    if (0 < prev2) {
      if (((prev < 0x20) && (((prev < 0x18 || (c < 0x20)) || (local_40 != 0)))) &&
         ((prev < 0x10 ||
          (((local_40 != 0 && ((int)local_40 < 0x20)) || ((uVar1 == 0 || (0x1f < uVar1)))))))) {
        fputc(0x2c,(FILE *)f);
      }
      else {
        fputs(",\n",(FILE *)f);
        prev = 0;
      }
    }
    __format = "\'%c\'";
    if (uVar1 < 0x20) {
      __format = "%u";
    }
    fprintf((FILE *)f,__format,(ulong)uVar1);
    c = local_40;
    prev = prev + 1;
    local_40 = uVar1;
  }
  if (postfix != (char *)0x0) {
    fputs(postfix,(FILE *)f);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeArrayOfMostlyInvChars(FILE *f,
                                const char *prefix,
                                const char *p, int32_t length,
                                const char *postfix) {
    int32_t i, col;
    int prev2, prev, c;

    if(prefix!=NULL) {
        fprintf(f, prefix, (long)length);
    }
    prev2=prev=-1;
    for(i=col=0; i<length; ++i, ++col) {
        c=(uint8_t)p[i];
        if(i>0) {
            /* Break long lines. Try to break at interesting places, to minimize revision diffs. */
            if( 
                /* Very long line. */
                col>=32 ||
                /* Long line, break after terminating NUL. */
                (col>=24 && prev2>=0x20 && prev==0) ||
                /* Medium-long line, break before non-NUL, non-character byte. */
                (col>=16 && (prev==0 || prev>=0x20) && 0<c && c<0x20)
            ) {
                fputs(",\n", f);
                col=0;
            } else {
                fputc(',', f);
            }
        }
        fprintf(f, c<0x20 ? "%u" : "'%c'", c);
        prev2=prev;
        prev=c;
    }
    if(postfix!=NULL) {
        fputs(postfix, f);
    }
}